

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

bool anon_unknown.dwarf_1147904::operator==
               (JBTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *l,JBTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *r)

{
  ArrayIndex AVar1;
  __type _Var2;
  size_type sVar3;
  size_type sVar4;
  const_reference pvVar5;
  ulong local_28;
  size_t i;
  JBTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *r_local;
  JBTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *l_local;
  
  _Var2 = std::operator==(&l->Value,&r->Value);
  if (_Var2) {
    sVar3 = std::
            vector<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
            ::size(&l->Backtraces);
    sVar4 = std::
            vector<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
            ::size(&r->Backtraces);
    if (sVar3 == sVar4) {
      for (local_28 = 0;
          sVar3 = std::
                  vector<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                  ::size(&l->Backtraces), local_28 < sVar3; local_28 = local_28 + 1) {
        pvVar5 = std::
                 vector<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                 ::operator[](&l->Backtraces,local_28);
        AVar1 = pvVar5->Index;
        pvVar5 = std::
                 vector<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                 ::operator[](&r->Backtraces,local_28);
        if (AVar1 != pvVar5->Index) {
          return false;
        }
      }
    }
  }
  return true;
}

Assistant:

bool operator==(JBTs<T> const& l, JBTs<T> const& r)
  {
    if ((l.Value == r.Value) && (l.Backtraces.size() == r.Backtraces.size())) {
      for (size_t i = 0; i < l.Backtraces.size(); i++) {
        if (l.Backtraces[i].Index != r.Backtraces[i].Index) {
          return false;
        }
      }
    }
    return true;
  }